

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffset
          (ReflectionSchema *this,FieldDescriptor *field)

{
  int iVar1;
  OneofDescriptor *pOVar2;
  Descriptor *this_00;
  char *pcVar3;
  int __c;
  FieldDescriptor *__s;
  size_t offset;
  FieldDescriptor *field_local;
  ReflectionSchema *this_local;
  
  __s = field;
  pOVar2 = FieldDescriptor::containing_oneof(field);
  if (pOVar2 == (OneofDescriptor *)0x0) {
    this_local._4_4_ = GetFieldOffsetNonOneof(this,field);
  }
  else {
    this_00 = FieldDescriptor::containing_type(field);
    iVar1 = Descriptor::field_count(this_00);
    pOVar2 = FieldDescriptor::containing_oneof(field);
    pcVar3 = OneofDescriptor::index(pOVar2,(char *)__s,__c);
    this_local._4_4_ = this->offsets_[iVar1 + (int)pcVar3];
  }
  return this_local._4_4_;
}

Assistant:

uint32 GetFieldOffset(const FieldDescriptor* field) const {
    if (field->containing_oneof()) {
      size_t offset = field->containing_type()->field_count() +
                      field->containing_oneof()->index();
      return offsets_[offset];
    } else {
      return GetFieldOffsetNonOneof(field);
    }
  }